

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_OneofFeaturesInherit_Test::TestBody
          (FeaturesTest_OneofFeaturesInherit_Test *this)

{
  OneofDescriptor *pOVar1;
  FileDescriptor *pFVar2;
  MessageLite *pMVar3;
  undefined8 extraout_RAX;
  char *pcVar4;
  pointer *__ptr;
  string_view file_text;
  Metadata MVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  MVar5 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar5.descriptor)->file_);
  MVar5 = pb::TestFeatures::GetMetadata((TestFeatures *)pb::_TestFeatures_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar5.descriptor)->file_);
  file_text._M_str =
       "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    dependency: \"google/protobuf/unittest_features.proto\"\n    options { features { enum_type: CLOSED } }\n    message_type {\n      name: \"Foo\"\n      field {\n        name: \"oneof_field\"\n        number: 1\n        label: LABEL_OPTIONAL\n        type: TYPE_INT64\n        oneof_index: 0\n      }\n      oneof_decl { name: \"foo_oneof\" }\n      options {\n        features {\n          [pb.test] { message_feature: VALUE9 }\n        }\n      }\n    }\n  "
  ;
  file_text._M_len = 0x1fc;
  pFVar2 = ValidationErrorTest::BuildFile((ValidationErrorTest *)this,file_text);
  if (pFVar2->message_type_count_ < 1) {
    TestBody();
  }
  else if (0 < pFVar2->message_types_->oneof_decl_count_) {
    pOVar1 = pFVar2->message_types_->oneof_decls_;
    pcVar4 = anon_var_dwarf_a22956 + 5;
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (anon_var_dwarf_a22956 + 5);
    testing::internal::
    PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
              (local_28,(char *)&local_38,(OneofOptions *)"oneof->options()");
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_20->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x2829,pcVar4);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_20,local_20);
    }
    local_38._M_head_impl._0_4_ = (pOVar1->merged_features_->field_0)._impl_.enum_type_;
    testing::internal::
    CmpHelperEQ<google::protobuf::FeatureSet_EnumType,google::protobuf::FeatureSet_EnumType>
              (local_28,"GetFeatures(oneof).enum_type()","FeatureSet::CLOSED",
               (FeatureSet_EnumType *)&local_38,&FeatureSet::CLOSED);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_20->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x282a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_20,local_20);
    }
    pMVar3 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pOVar1->merged_features_->field_0)._impl_._extensions_,pb::test,
                        (MessageLite *)PTR__TestFeatures_default_instance__01970360);
    local_38._M_head_impl._0_4_ = *(undefined4 *)&pMVar3[2]._vptr_MessageLite;
    local_30.data_._0_4_ = 9;
    testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
              (local_28,"GetFeatures(oneof).GetExtension(pb::test).message_feature()","pb::VALUE9",
               (EnumFeature *)&local_38,(EnumFeature *)&local_30);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar4 = (local_20->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x282c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_20,local_20);
    }
    return;
  }
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (local_38._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))();
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(FeaturesTest, OneofFeaturesInherit) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    dependency: "google/protobuf/unittest_features.proto"
    options { features { enum_type: CLOSED } }
    message_type {
      name: "Foo"
      field {
        name: "oneof_field"
        number: 1
        label: LABEL_OPTIONAL
        type: TYPE_INT64
        oneof_index: 0
      }
      oneof_decl { name: "foo_oneof" }
      options {
        features {
          [pb.test] { message_feature: VALUE9 }
        }
      }
    }
  )pb");
  const OneofDescriptor* oneof = file->message_type(0)->oneof_decl(0);
  EXPECT_THAT(oneof->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(oneof).enum_type(), FeatureSet::CLOSED);
  EXPECT_EQ(GetFeatures(oneof).GetExtension(pb::test).message_feature(),
            pb::VALUE9);
}